

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::contextMenuEvent(QPlainTextEdit *this,QContextMenuEvent *e)

{
  QPlainTextEditPrivate *d;
  QPlainTextEditPrivate *in_stack_00000018;
  
  d_func((QPlainTextEdit *)0x6c702c);
  QPlainTextEditPrivate::sendControlEvent(in_stack_00000018,(QEvent *)this);
  return;
}

Assistant:

void QPlainTextEdit::contextMenuEvent(QContextMenuEvent *e)
{
    Q_D(QPlainTextEdit);
    d->sendControlEvent(e);
}